

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcRelOverridesProperties::IfcRelOverridesProperties
          (IfcRelOverridesProperties *this)

{
  IfcRelOverridesProperties *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x100,"IfcRelOverridesProperties");
  IfcRelDefinesByProperties::IfcRelDefinesByProperties
            (&this->super_IfcRelDefinesByProperties,&PTR_construction_vtable_24__00e96a30);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelOverridesProperties,_1UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelOverridesProperties,_1UL> *)
             &(this->super_IfcRelDefinesByProperties).field_0xd8,
             &PTR_construction_vtable_24__00e96ae0);
  *(undefined8 *)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines = 0xe96950;
  *(undefined8 *)&this->field_0x100 = 0xe96a18;
  *(undefined8 *)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0x88 = 0xe96978;
  (this->super_IfcRelDefinesByProperties).super_IfcRelDefines.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRelDefines,_1UL>._vptr_ObjectHelper =
       (_func_int **)0xe969a0;
  *(undefined8 *)&(this->super_IfcRelDefinesByProperties).super_IfcRelDefines.field_0xc0 = 0xe969c8;
  *(undefined8 *)&(this->super_IfcRelDefinesByProperties).field_0xd8 = 0xe969f0;
  STEP::ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL>::ListOf
            ((ListOf<Assimp::STEP::Lazy<Assimp::IFC::Schema_2x3::IfcProperty>,_1UL,_0UL> *)
             &(this->super_IfcRelDefinesByProperties).field_0xe8);
  return;
}

Assistant:

IfcRelOverridesProperties() : Object("IfcRelOverridesProperties") {}